

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespace.h
# Opt level: O2

void kNameSpace_ImportSyntax2(KonohaContext *kctx,kNameSpace *ns,kSyntax *syn)

{
  kFunc *pkVar1;
  kObject_conflict *pkVar2;
  TokenizeFunc *pp_Var3;
  kObject_conflict *pkVar4;
  long lVar5;
  
  if ((syn->flag & 2) != 0) {
    pkVar2 = (kObject_conflict *)ns->metaPatternList;
    if (pkVar2 == (kObject_conflict *)kctx->share->emptyArray) {
      pkVar2 = (*kctx->klib->new_kObject)
                         (kctx,ns->NameSpaceConstList,
                          *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x30),0);
      ns->metaPatternList = (kArray *)pkVar2;
    }
    (*kctx->klib->kArray_Add)(kctx,(kArray *)pkVar2,syn);
  }
  lVar5 = (long)syn->tokenKonohaChar;
  if (0 < lVar5) {
    pkVar1 = syn->TokenFuncNULL;
    pp_Var3 = kNameSpace_tokenMatrix(kctx,ns);
    pkVar2 = (kObject_conflict *)pp_Var3[lVar5 + 0x29];
    (*kctx->klib->kArray_Add)(kctx,ns->NameSpaceConstList,pkVar1);
    if (pkVar2 == (kObject_conflict *)0x0) {
      pp_Var3[lVar5 + 0x29] = (TokenizeFunc)pkVar1;
    }
    else {
      pkVar4 = pkVar2;
      if (((pkVar2->h).ct)->baseTypeId != 6) {
        pkVar4 = (*kctx->klib->new_kObject)
                           (kctx,ns->NameSpaceConstList,
                            *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x30),0);
        pp_Var3[lVar5 + 0x29] = (TokenizeFunc)pkVar4;
        (*kctx->klib->kArray_Add)(kctx,(kArray *)pkVar4,pkVar2);
      }
      (*kctx->klib->kArray_Add)(kctx,(kArray *)pkVar4,pkVar1);
    }
    (*kctx->klib->kMethod_DoLazyCompilation)(kctx,pkVar1->method,(kparamtype_t *)0x0,0);
  }
  kNameSpace_ResetSyntaxList(kctx,ns,syn->keyword);
  return;
}

Assistant:

static void kNameSpace_ImportSyntax2(KonohaContext *kctx, kNameSpace *ns, kSyntax *syn)
{
	if(kSyntax_Is(MetaPattern, syn)) {
		if(ns->metaPatternList == K_EMPTYARRAY) {
			ns->metaPatternList = new_(Array, 0, ns->NameSpaceConstList);
		}
		KLIB kArray_Add(kctx, ns->metaPatternList, syn);
	}
	if(syn->tokenKonohaChar > 0) {
		kNameSpace_SetTokenFuncMatrix(kctx, ns, syn->tokenKonohaChar, syn->TokenFuncNULL);
	}
	kNameSpace_ResetSyntaxList(kctx, ns, syn->keyword);
}